

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3Fts3DoclistPrev
               (int bDescIdx,char *aDoclist,int nDoclist,char **ppIter,sqlite3_int64 *piDocid,
               int *pnList,u8 *pbEof)

{
  sqlite3_int64 sVar1;
  int iVar2;
  bool bVar3;
  char *pSave;
  sqlite3_int64 iDelta_1;
  long lStack_70;
  int iMul_1;
  sqlite3_int64 iDelta;
  char *pcStack_60;
  int iMul;
  char *pEnd;
  char *pDocid;
  char *pNext;
  sqlite3_int64 iDocid;
  char *p;
  int *pnList_local;
  sqlite3_int64 *piDocid_local;
  char **ppIter_local;
  char *pcStack_18;
  int nDoclist_local;
  char *aDoclist_local;
  int bDescIdx_local;
  
  iDocid = (sqlite3_int64)*ppIter;
  p = (char *)pnList;
  pnList_local = (int *)piDocid;
  piDocid_local = (sqlite3_int64 *)ppIter;
  ppIter_local._4_4_ = nDoclist;
  pcStack_18 = aDoclist;
  aDoclist_local._4_4_ = bDescIdx;
  if ((char *)iDocid == (char *)0x0) {
    pNext = (char *)0x0;
    pDocid = (char *)0x0;
    pcStack_60 = aDoclist + nDoclist;
    iDelta._4_4_ = 1;
    iDocid = 0;
    pEnd = aDoclist;
    while (pEnd < pcStack_60) {
      iVar2 = sqlite3Fts3GetVarint(pEnd,&stack0xffffffffffffff90);
      pEnd = pEnd + iVar2;
      pNext = pNext + iDelta._4_4_ * lStack_70;
      pDocid = pEnd;
      fts3PoslistCopy((char **)0x0,&pEnd);
      while( true ) {
        bVar3 = false;
        if (pEnd < pcStack_60) {
          bVar3 = *pEnd == '\0';
        }
        if (!bVar3) break;
        pEnd = pEnd + 1;
      }
      iDelta._4_4_ = 1;
      if (aDoclist_local._4_4_ != 0) {
        iDelta._4_4_ = -1;
      }
    }
    *(int *)p = (int)pcStack_60 - (int)pDocid;
    *piDocid_local = (sqlite3_int64)pDocid;
    *(char **)pnList_local = pNext;
  }
  else {
    iDelta_1._4_4_ = 1;
    if (bDescIdx != 0) {
      iDelta_1._4_4_ = -1;
    }
    fts3GetReverseVarint((char **)&iDocid,aDoclist,(sqlite3_int64 *)&pSave);
    sVar1 = iDocid;
    *(long *)pnList_local = *(long *)pnList_local - (long)iDelta_1._4_4_ * (long)pSave;
    if ((char *)iDocid == pcStack_18) {
      *pbEof = '\x01';
    }
    else {
      fts3ReversePoslist(pcStack_18,(char **)&iDocid);
      *(int *)p = (int)sVar1 - (int)iDocid;
    }
    *piDocid_local = iDocid;
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3Fts3DoclistPrev(
  int bDescIdx,                   /* True if the doclist is desc */
  char *aDoclist,                 /* Pointer to entire doclist */
  int nDoclist,                   /* Length of aDoclist in bytes */
  char **ppIter,                  /* IN/OUT: Iterator pointer */
  sqlite3_int64 *piDocid,         /* IN/OUT: Docid pointer */
  int *pnList,                    /* OUT: List length pointer */
  u8 *pbEof                       /* OUT: End-of-file flag */
){
  char *p = *ppIter;

  assert( nDoclist>0 );
  assert( *pbEof==0 );
  assert( p || *piDocid==0 );
  assert( !p || (p>aDoclist && p<&aDoclist[nDoclist]) );

  if( p==0 ){
    sqlite3_int64 iDocid = 0;
    char *pNext = 0;
    char *pDocid = aDoclist;
    char *pEnd = &aDoclist[nDoclist];
    int iMul = 1;

    while( pDocid<pEnd ){
      sqlite3_int64 iDelta;
      pDocid += sqlite3Fts3GetVarint(pDocid, &iDelta);
      iDocid += (iMul * iDelta);
      pNext = pDocid;
      fts3PoslistCopy(0, &pDocid);
      while( pDocid<pEnd && *pDocid==0 ) pDocid++;
      iMul = (bDescIdx ? -1 : 1);
    }

    *pnList = (int)(pEnd - pNext);
    *ppIter = pNext;
    *piDocid = iDocid;
  }else{
    int iMul = (bDescIdx ? -1 : 1);
    sqlite3_int64 iDelta;
    fts3GetReverseVarint(&p, aDoclist, &iDelta);
    *piDocid -= (iMul * iDelta);

    if( p==aDoclist ){
      *pbEof = 1;
    }else{
      char *pSave = p;
      fts3ReversePoslist(aDoclist, &p);
      *pnList = (int)(pSave - p);
    }
    *ppIter = p;
  }
}